

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-threadpool-cancel.c
# Opt level: O3

int run_test_threadpool_cancel_work(void)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 extraout_RAX;
  undefined8 in_R9;
  long lVar3;
  cancel_info ci;
  uv_work_t reqs [16];
  undefined1 local_8c0 [152];
  undefined1 local_828 [2056];
  
  uVar2 = uv_default_loop();
  saturate_threadpool();
  lVar3 = 0;
  do {
    iVar1 = uv_queue_work(uVar2,local_828 + lVar3,work2_cb,done2_cb);
    if (iVar1 != 0) {
      run_test_threadpool_cancel_work_cold_1();
      goto LAB_001761e3;
    }
    lVar3 = lVar3 + 0x80;
  } while (lVar3 != 0x800);
  iVar1 = uv_timer_init(uVar2,local_8c0);
  if (iVar1 == 0) {
    iVar1 = uv_timer_start(local_8c0,timer_cb,10,0);
    if (iVar1 != 0) goto LAB_001761e8;
    iVar1 = uv_run(uVar2,0);
    if (iVar1 != 0) goto LAB_001761ed;
    if (timer_cb_called != 1) goto LAB_001761f2;
    if (done2_cb_called == 0x10) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_001761fc;
    }
  }
  else {
LAB_001761e3:
    run_test_threadpool_cancel_work_cold_2();
LAB_001761e8:
    run_test_threadpool_cancel_work_cold_3();
LAB_001761ed:
    run_test_threadpool_cancel_work_cold_4();
LAB_001761f2:
    run_test_threadpool_cancel_work_cold_5();
  }
  run_test_threadpool_cancel_work_cold_6();
LAB_001761fc:
  run_test_threadpool_cancel_work_cold_7();
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-threadpool-cancel.c"
          ,0x75,"0 && \"work2_cb called\"",in_R9,extraout_RAX);
  abort();
}

Assistant:

TEST_IMPL(threadpool_cancel_work) {
  struct cancel_info ci;
  uv_work_t reqs[16];
  uv_loop_t* loop;
  unsigned i;

  INIT_CANCEL_INFO(&ci, reqs);
  loop = uv_default_loop();
  saturate_threadpool();

  for (i = 0; i < ARRAY_SIZE(reqs); i++)
    ASSERT(0 == uv_queue_work(loop, reqs + i, work2_cb, done2_cb));

  ASSERT(0 == uv_timer_init(loop, &ci.timer_handle));
  ASSERT(0 == uv_timer_start(&ci.timer_handle, timer_cb, 10, 0));
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
  ASSERT(1 == timer_cb_called);
  ASSERT(ARRAY_SIZE(reqs) == done2_cb_called);

  MAKE_VALGRIND_HAPPY();
  return 0;
}